

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-reader.c
# Opt level: O0

int check_boms(void)

{
  uint uVar1;
  uchar *input;
  int iVar2;
  uchar *local_210;
  char *end;
  char *start;
  int result;
  int check;
  char *title;
  int k;
  int failed;
  yaml_parser_t parser;
  
  title._4_4_ = 0;
  printf("checking boms...\n");
  title._0_4_ = 0;
  while (boms[(int)title].test != (char *)0x0) {
    uVar1 = boms[(int)title].result;
    input = (uchar *)boms[(int)title].test;
    for (local_210 = input; *local_210 != '!'; local_210 = local_210 + 1) {
    }
    printf("\t%s: ",boms[(int)title].title);
    yaml_parser_initialize((yaml_parser_t *)&k);
    yaml_parser_set_input_string((yaml_parser_t *)&k,input,(long)local_210 - (long)input);
    iVar2 = yaml_parser_update_buffer((yaml_parser_t *)&k,(long)local_210 - (long)input);
    if (iVar2 == 0) {
      printf("- (reader error: %s at %ld)\n",parser._0_8_,parser.problem);
      title._4_4_ = title._4_4_ + 1;
    }
    else if (parser.buffer.last == (yaml_char_t *)(long)(int)uVar1) {
      iVar2 = memcmp((void *)parser._128_8_,bom_original,(long)(int)uVar1);
      if (iVar2 == 0) {
        printf("+\n");
      }
      else {
        printf("- (value \'%s\' does not equal to the original value \'%s\')\n",parser._128_8_,
               bom_original);
        title._4_4_ = title._4_4_ + 1;
      }
    }
    else {
      printf("- (length=%ld while expected length=%d)\n",parser.buffer.last,(ulong)uVar1);
      title._4_4_ = title._4_4_ + 1;
    }
    yaml_parser_delete((yaml_parser_t *)&k);
    title._0_4_ = (int)title + 1;
  }
  printf("checking boms: %d fail(s)\n",(ulong)title._4_4_);
  return title._4_4_;
}

Assistant:

int check_boms(void)
{
    yaml_parser_t parser;
    int failed = 0;
    int k;
    printf("checking boms...\n");
    for (k = 0; boms[k].test; k++) {
        char *title = boms[k].title;
        int check = boms[k].result;
        int result;
        char *start = boms[k].test;
        char *end = start;
        while (*end != '!') end++;
        printf("\t%s: ", title);
        yaml_parser_initialize(&parser);
        yaml_parser_set_input_string(&parser, (unsigned char *)start, end-start);
        result = yaml_parser_update_buffer(&parser, end-start);
        if (!result) {
            printf("- (reader error: %s at %ld)\n", parser.problem, (long)parser.problem_offset);
            failed++;
        }
        else {
            if (parser.unread != check) {
                printf("- (length=%ld while expected length=%d)\n", (long)parser.unread, check);
                failed++;
            }
            else if (memcmp(parser.buffer.start, bom_original, check) != 0) {
                printf("- (value '%s' does not equal to the original value '%s')\n", parser.buffer.start, bom_original);
                failed++;
            }
            else {
                printf("+\n");
            }
        }
        yaml_parser_delete(&parser);
    }
    printf("checking boms: %d fail(s)\n", failed);
    return failed;
}